

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::HairSetNode::compact_vertices(HairSetNode *this)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in;
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  pointer pHVar5;
  size_t sVar6;
  undefined8 uVar7;
  pointer pvVar8;
  bool bVar9;
  Vec3fx *pVVar10;
  Vec3fx *pVVar11;
  size_t i_1;
  ulong uVar12;
  ulong uVar13;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *v;
  long lVar14;
  pointer pvVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  size_t i;
  ulong uVar22;
  size_t k;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  allocator_type local_a9;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  HairSetNode *local_98;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  positions_o;
  
  in = &this->positions;
  local_98 = this;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector(&positions_o,
           (long)(this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,&local_a9);
  lVar14 = 8;
  for (uVar22 = 0;
      pvVar15 = (local_98->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar22 < (ulong)((long)(local_98->positions).
                             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 5);
      uVar22 = uVar22 + 1) {
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::reserve(&positions_o,*(size_type *)(&pvVar15->field_0x0 + lVar14));
    lVar14 = lVar14 + 0x20;
  }
  uVar22 = 0;
  while( true ) {
    pHVar5 = (local_98->hairs).
             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar15 = positions_o.
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_98->hairs).
                      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar5 >> 3) <= uVar22)
    break;
    uVar4 = pHVar5[uVar22].vertex;
    uVar16 = (ulong)uVar4;
    sVar6 = (positions_o.
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->size_active;
    bVar9 = test_location(in,uVar16,&positions_o,sVar6 - 1);
    uVar21 = (uint)sVar6;
    if (bVar9) {
      pHVar5[uVar22].vertex = uVar21 - 1;
      local_a8 = (ulong)(uVar4 + 1) << 4;
      for (uVar16 = 0;
          pvVar8 = positions_o.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          pvVar15 = (local_98->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)((long)(local_98->positions).
                                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 5);
          uVar16 = uVar16 + 1) {
        pfVar1 = (float *)((long)&(pvVar15[uVar16].items)->field_0 + local_a8);
        fVar25 = *pfVar1;
        fVar26 = pfVar1[1];
        fVar23 = pfVar1[2];
        fVar24 = pfVar1[3];
        sVar6 = positions_o.
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].size_active;
        uVar12 = positions_o.
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].size_alloced;
        uVar18 = sVar6 + 1;
        if (uVar12 < uVar18) {
          uVar13 = uVar12;
          uVar17 = uVar18;
          if (uVar12 != 0) {
            for (; uVar17 = uVar13, uVar13 < uVar18; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0))
            {
            }
          }
          if (uVar12 != uVar17) {
            pVVar11 = positions_o.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].items;
            pVVar10 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
            pvVar8[uVar16].items = pVVar10;
            lVar14 = 0;
            for (uVar12 = 0; uVar12 < pvVar8[uVar16].size_active; uVar12 = uVar12 + 1) {
              puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
              uVar7 = puVar3[1];
              puVar2 = (undefined8 *)((long)&(pvVar8[uVar16].items)->field_0 + lVar14);
              *puVar2 = *puVar3;
              puVar2[1] = uVar7;
              lVar14 = lVar14 + 0x10;
            }
            alignedFree(pVVar11);
            pvVar8[uVar16].size_active = sVar6;
            pvVar8[uVar16].size_alloced = uVar17;
          }
        }
        pvVar15 = positions_o.
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar8[uVar16].size_active = uVar18;
        pVVar11 = pvVar8[uVar16].items + sVar6;
        (pVVar11->field_0).m128[0] = fVar25;
        (pVVar11->field_0).m128[1] = fVar26;
        (pVVar11->field_0).m128[2] = fVar23;
        (pVVar11->field_0).m128[3] = fVar24;
        pVVar11 = (in->
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar16].items + (uVar4 + 2);
        fVar25 = (pVVar11->field_0).m128[0];
        fVar26 = (pVVar11->field_0).m128[1];
        fVar23 = (pVVar11->field_0).m128[2];
        fVar24 = (pVVar11->field_0).m128[3];
        sVar6 = positions_o.
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].size_active;
        uVar12 = positions_o.
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].size_alloced;
        uVar18 = sVar6 + 1;
        if (uVar12 < uVar18) {
          uVar13 = uVar12;
          uVar17 = uVar18;
          if (uVar12 != 0) {
            for (; uVar17 = uVar13, uVar13 < uVar18; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0))
            {
            }
          }
          if (uVar12 != uVar17) {
            pVVar11 = positions_o.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].items;
            pVVar10 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
            pvVar15[uVar16].items = pVVar10;
            lVar14 = 0;
            for (uVar12 = 0; uVar12 < pvVar15[uVar16].size_active; uVar12 = uVar12 + 1) {
              puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
              uVar7 = puVar3[1];
              puVar2 = (undefined8 *)((long)&(pvVar15[uVar16].items)->field_0 + lVar14);
              *puVar2 = *puVar3;
              puVar2[1] = uVar7;
              lVar14 = lVar14 + 0x10;
            }
            alignedFree(pVVar11);
            pvVar15[uVar16].size_active = sVar6;
            pvVar15[uVar16].size_alloced = uVar17;
          }
        }
        pvVar8 = positions_o.
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar15[uVar16].size_active = uVar18;
        pVVar11 = pvVar15[uVar16].items + sVar6;
        (pVVar11->field_0).m128[0] = fVar25;
        (pVVar11->field_0).m128[1] = fVar26;
        (pVVar11->field_0).m128[2] = fVar23;
        (pVVar11->field_0).m128[3] = fVar24;
        pVVar11 = (in->
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar16].items + (uVar4 + 3);
        fVar25 = (pVVar11->field_0).m128[0];
        fVar26 = (pVVar11->field_0).m128[1];
        fVar23 = (pVVar11->field_0).m128[2];
        fVar24 = (pVVar11->field_0).m128[3];
        sVar6 = positions_o.
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].size_active;
        uVar12 = positions_o.
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].size_alloced;
        uVar18 = sVar6 + 1;
        if (uVar12 < uVar18) {
          uVar13 = uVar12;
          uVar17 = uVar18;
          if (uVar12 != 0) {
            for (; uVar17 = uVar13, uVar13 < uVar18; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0))
            {
            }
          }
          if (uVar12 != uVar17) {
            pVVar11 = positions_o.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].items;
            pVVar10 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
            pvVar8[uVar16].items = pVVar10;
            lVar14 = 0;
            for (uVar12 = 0; uVar12 < pvVar8[uVar16].size_active; uVar12 = uVar12 + 1) {
              puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
              uVar7 = puVar3[1];
              puVar2 = (undefined8 *)((long)&(pvVar8[uVar16].items)->field_0 + lVar14);
              *puVar2 = *puVar3;
              puVar2[1] = uVar7;
              lVar14 = lVar14 + 0x10;
            }
            alignedFree(pVVar11);
            pvVar8[uVar16].size_active = sVar6;
            pvVar8[uVar16].size_alloced = uVar17;
          }
        }
        pvVar8[uVar16].size_active = uVar18;
        pVVar11 = pvVar8[uVar16].items + sVar6;
        (pVVar11->field_0).m128[0] = fVar25;
        (pVVar11->field_0).m128[1] = fVar26;
        (pVVar11->field_0).m128[2] = fVar23;
        (pVVar11->field_0).m128[3] = fVar24;
      }
    }
    else {
      bVar9 = test_location(in,uVar16,&positions_o,sVar6 - 3);
      if (bVar9) {
        pHVar5[uVar22].vertex = uVar21 - 3;
        for (uVar16 = 0;
            pvVar8 = positions_o.
                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            pvVar15 = (local_98->positions).
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            uVar16 < (ulong)((long)(local_98->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 5);
            uVar16 = uVar16 + 1) {
          pVVar11 = pvVar15[uVar16].items + (uVar4 + 3);
          fVar25 = (pVVar11->field_0).m128[2];
          fVar26 = (pVVar11->field_0).m128[3];
          sVar6 = positions_o.
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].size_active;
          uVar12 = positions_o.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].size_alloced;
          uVar18 = sVar6 + 1;
          fVar23 = (pVVar11->field_0).m128[0];
          fVar24 = (pVVar11->field_0).m128[1];
          if (uVar12 < uVar18) {
            uVar13 = uVar12;
            uVar17 = uVar18;
            if (uVar12 != 0) {
              for (; uVar17 = uVar13, uVar13 < uVar18;
                  uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
              }
            }
            if (uVar12 != uVar17) {
              pVVar10 = positions_o.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar16].items;
              local_a8 = *(ulong *)&pVVar11->field_0;
              fStack_a0 = fVar25;
              fStack_9c = fVar26;
              pVVar11 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
              pvVar8[uVar16].items = pVVar11;
              lVar14 = 0;
              for (uVar12 = 0; uVar12 < pvVar8[uVar16].size_active; uVar12 = uVar12 + 1) {
                puVar3 = (undefined8 *)((long)&pVVar10->field_0 + lVar14);
                uVar7 = puVar3[1];
                puVar2 = (undefined8 *)((long)&(pvVar8[uVar16].items)->field_0 + lVar14);
                *puVar2 = *puVar3;
                puVar2[1] = uVar7;
                lVar14 = lVar14 + 0x10;
              }
              alignedFree(pVVar10);
              pvVar8[uVar16].size_active = sVar6;
              pvVar8[uVar16].size_alloced = uVar17;
              fVar23 = (float)local_a8;
              fVar24 = local_a8._4_4_;
              fVar25 = fStack_a0;
              fVar26 = fStack_9c;
            }
          }
          pvVar8[uVar16].size_active = uVar18;
          pVVar11 = pvVar8[uVar16].items + sVar6;
          (pVVar11->field_0).m128[0] = fVar23;
          (pVVar11->field_0).m128[1] = fVar24;
          (pVVar11->field_0).m128[2] = fVar25;
          (pVVar11->field_0).m128[3] = fVar26;
        }
      }
      else {
        pHVar5[uVar22].vertex = uVar21;
        uVar18 = 0;
        while (pvVar8 = positions_o.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              pvVar15 = (local_98->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              uVar18 < (ulong)((long)(local_98->positions).
                                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 5
                              )) {
          pVVar11 = pvVar15[uVar18].items + uVar16;
          fVar25 = (pVVar11->field_0).m128[0];
          fVar26 = (pVVar11->field_0).m128[1];
          fVar23 = (pVVar11->field_0).m128[2];
          fVar24 = (pVVar11->field_0).m128[3];
          sVar6 = positions_o.
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18].size_active;
          uVar13 = positions_o.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].size_alloced;
          uVar12 = sVar6 + 1;
          uVar17 = uVar18;
          if (uVar13 < uVar12) {
            uVar19 = uVar13;
            uVar20 = uVar12;
            if (uVar13 != 0) {
              for (; uVar20 = uVar19, uVar19 < uVar12;
                  uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
              }
            }
            if (uVar13 != uVar20) {
              pVVar11 = positions_o.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar18].items;
              local_a8 = uVar18;
              pVVar10 = (Vec3fx *)alignedMalloc(uVar20 << 4,0x10);
              pvVar8[uVar18].items = pVVar10;
              lVar14 = 0;
              for (uVar13 = 0; uVar13 < pvVar8[uVar18].size_active; uVar13 = uVar13 + 1) {
                puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                uVar7 = puVar3[1];
                puVar2 = (undefined8 *)((long)&(pvVar8[uVar18].items)->field_0 + lVar14);
                *puVar2 = *puVar3;
                puVar2[1] = uVar7;
                lVar14 = lVar14 + 0x10;
              }
              alignedFree(pVVar11);
              pvVar8[uVar18].size_active = sVar6;
              pvVar8[uVar18].size_alloced = uVar20;
              uVar17 = local_a8;
            }
          }
          pvVar15 = positions_o.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar8[uVar18].size_active = uVar12;
          pVVar11 = pvVar8[uVar18].items + sVar6;
          (pVVar11->field_0).m128[0] = fVar25;
          (pVVar11->field_0).m128[1] = fVar26;
          (pVVar11->field_0).m128[2] = fVar23;
          (pVVar11->field_0).m128[3] = fVar24;
          pVVar11 = (in->
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar18].items + (uVar4 + 1);
          fVar25 = (pVVar11->field_0).m128[0];
          fVar26 = (pVVar11->field_0).m128[1];
          fVar23 = (pVVar11->field_0).m128[2];
          fVar24 = (pVVar11->field_0).m128[3];
          sVar6 = positions_o.
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18].size_active;
          uVar13 = positions_o.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].size_alloced;
          uVar12 = sVar6 + 1;
          if (uVar13 < uVar12) {
            uVar19 = uVar13;
            uVar20 = uVar12;
            if (uVar13 != 0) {
              for (; uVar20 = uVar19, uVar19 < uVar12;
                  uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
              }
            }
            if (uVar13 != uVar20) {
              pVVar11 = positions_o.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar18].items;
              local_a8 = uVar17;
              pVVar10 = (Vec3fx *)alignedMalloc(uVar20 << 4,0x10);
              pvVar15[uVar18].items = pVVar10;
              lVar14 = 0;
              for (uVar13 = 0; uVar13 < pvVar15[uVar18].size_active; uVar13 = uVar13 + 1) {
                puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                uVar7 = puVar3[1];
                puVar2 = (undefined8 *)((long)&(pvVar15[uVar18].items)->field_0 + lVar14);
                *puVar2 = *puVar3;
                puVar2[1] = uVar7;
                lVar14 = lVar14 + 0x10;
              }
              alignedFree(pVVar11);
              pvVar15[uVar18].size_active = sVar6;
              pvVar15[uVar18].size_alloced = uVar20;
              uVar17 = local_a8;
            }
          }
          pvVar8 = positions_o.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar15[uVar18].size_active = uVar12;
          pVVar11 = pvVar15[uVar18].items + sVar6;
          (pVVar11->field_0).m128[0] = fVar25;
          (pVVar11->field_0).m128[1] = fVar26;
          (pVVar11->field_0).m128[2] = fVar23;
          (pVVar11->field_0).m128[3] = fVar24;
          pVVar11 = (in->
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar18].items + (uVar4 + 2);
          fVar25 = (pVVar11->field_0).m128[0];
          fVar26 = (pVVar11->field_0).m128[1];
          fVar23 = (pVVar11->field_0).m128[2];
          fVar24 = (pVVar11->field_0).m128[3];
          sVar6 = positions_o.
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18].size_active;
          uVar13 = positions_o.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].size_alloced;
          uVar12 = sVar6 + 1;
          if (uVar13 < uVar12) {
            uVar19 = uVar13;
            uVar20 = uVar12;
            if (uVar13 != 0) {
              for (; uVar20 = uVar19, uVar19 < uVar12;
                  uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
              }
            }
            if (uVar13 != uVar20) {
              pVVar11 = positions_o.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar18].items;
              local_a8 = uVar17;
              pVVar10 = (Vec3fx *)alignedMalloc(uVar20 << 4,0x10);
              pvVar8[uVar18].items = pVVar10;
              lVar14 = 0;
              for (uVar13 = 0; uVar13 < pvVar8[uVar18].size_active; uVar13 = uVar13 + 1) {
                puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                uVar7 = puVar3[1];
                puVar2 = (undefined8 *)((long)&(pvVar8[uVar18].items)->field_0 + lVar14);
                *puVar2 = *puVar3;
                puVar2[1] = uVar7;
                lVar14 = lVar14 + 0x10;
              }
              alignedFree(pVVar11);
              pvVar8[uVar18].size_active = sVar6;
              pvVar8[uVar18].size_alloced = uVar20;
              uVar17 = local_a8;
            }
          }
          pvVar15 = positions_o.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar8[uVar18].size_active = uVar12;
          pVVar11 = pvVar8[uVar18].items + sVar6;
          (pVVar11->field_0).m128[0] = fVar25;
          (pVVar11->field_0).m128[1] = fVar26;
          (pVVar11->field_0).m128[2] = fVar23;
          (pVVar11->field_0).m128[3] = fVar24;
          pVVar11 = (in->
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar18].items + (uVar4 + 3);
          fVar25 = (pVVar11->field_0).m128[2];
          fVar26 = (pVVar11->field_0).m128[3];
          sVar6 = positions_o.
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18].size_active;
          uVar13 = positions_o.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].size_alloced;
          uVar12 = sVar6 + 1;
          fVar23 = (pVVar11->field_0).m128[0];
          fVar24 = (pVVar11->field_0).m128[1];
          if (uVar13 < uVar12) {
            uVar19 = uVar13;
            uVar20 = uVar12;
            if (uVar13 != 0) {
              for (; uVar20 = uVar19, uVar19 < uVar12;
                  uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
              }
            }
            if (uVar13 != uVar20) {
              pVVar10 = positions_o.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar18].items;
              local_a8 = *(ulong *)&pVVar11->field_0;
              fStack_a0 = fVar25;
              fStack_9c = fVar26;
              pVVar11 = (Vec3fx *)alignedMalloc(uVar20 << 4,0x10);
              pvVar15[uVar18].items = pVVar11;
              lVar14 = 0;
              for (uVar13 = 0; uVar13 < pvVar15[uVar18].size_active; uVar13 = uVar13 + 1) {
                puVar3 = (undefined8 *)((long)&pVVar10->field_0 + lVar14);
                uVar7 = puVar3[1];
                puVar2 = (undefined8 *)((long)&(pvVar15[uVar18].items)->field_0 + lVar14);
                *puVar2 = *puVar3;
                puVar2[1] = uVar7;
                lVar14 = lVar14 + 0x10;
              }
              alignedFree(pVVar10);
              pvVar15[uVar18].size_active = sVar6;
              pvVar15[uVar18].size_alloced = uVar20;
              fVar23 = (float)local_a8;
              fVar24 = local_a8._4_4_;
              fVar25 = fStack_a0;
              fVar26 = fStack_9c;
            }
          }
          pvVar15[uVar18].size_active = uVar12;
          pVVar11 = pvVar15[uVar18].items + sVar6;
          (pVVar11->field_0).m128[0] = fVar23;
          (pVVar11->field_0).m128[1] = fVar24;
          (pVVar11->field_0).m128[2] = fVar25;
          (pVVar11->field_0).m128[3] = fVar26;
          uVar18 = uVar17 + 1;
        }
      }
    }
    uVar22 = uVar22 + 1;
  }
  for (; pvVar15 !=
         positions_o.
         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish; pvVar15 = pvVar15 + 1) {
    sVar6 = pvVar15->size_active;
    if (pvVar15->size_alloced != sVar6) {
      pVVar11 = pvVar15->items;
      pVVar10 = (Vec3fx *)alignedMalloc(sVar6 << 4,0x10);
      pvVar15->items = pVVar10;
      lVar14 = 0;
      for (uVar22 = 0; uVar22 < pvVar15->size_active; uVar22 = uVar22 + 1) {
        puVar2 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar15->items->field_0 + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar14 = lVar14 + 0x10;
      }
      alignedFree(pVVar11);
      pvVar15->size_active = sVar6;
      pvVar15->size_alloced = sVar6;
    }
  }
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::_M_move_assign(in,&positions_o);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::~vector(&positions_o);
  return;
}

Assistant:

void SceneGraph::HairSetNode::compact_vertices()
  {
    std::vector<avector<Vec3ff>> positions_o(positions.size());
    for (size_t i=0; i<positions.size(); i++)
      positions_o.reserve(positions[i].size());
    
    for (size_t i=0; i<hairs.size(); i++) 
    {
      unsigned idx = hairs[i].vertex;
      if (test_location(positions,idx,positions_o,positions_o[0].size()-1)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-1;
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }

      else if (test_location(positions,idx,positions_o,positions_o[0].size()-3)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-3;
        for (size_t k=0; k<positions.size(); k++)
          positions_o[k].push_back(positions[k][idx+3]);
      }

      else
      {
        hairs[i].vertex = (unsigned) positions_o[0].size();
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+0]);
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }
    }

    for (auto& v : positions_o)
      v.shrink_to_fit();
   
    positions = std::move(positions_o);
  }